

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mytools.cpp
# Opt level: O2

size_t jpgClean(uchar *data,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  uchar *puVar3;
  
  sVar1 = 0;
  for (puVar3 = data + 1;
      (uVar2 = len, sVar1 != len &&
      (((puVar3[-1] != 0xff || (len < sVar1 + 1)) || (uVar2 = sVar1 + 1, *puVar3 != 0xd9))));
      puVar3 = puVar3 + 1) {
    sVar1 = sVar1 + 1;
  }
  return uVar2;
}

Assistant:

size_t jpgClean(const unsigned char *data, size_t len)
{
    uint8_t EOI[2] = {0xff, 0xd9};

    for(size_t i=0; i<len; i++)
    {
        if(*data++ == EOI[0]) {
            if(*data == EOI[1]) {
                if(i+1 <= len) {
                    return (i+1);
                }
            }
        }
    }
    return len;
}